

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

Aig_Obj_t ** Ssw_ClassesReadClass(Ssw_Cla_t *p,Aig_Obj_t *pRepr,int *pnSize)

{
  Aig_Obj_t ***pppAVar1;
  
  pppAVar1 = p->pId2Class;
  if (pppAVar1[pRepr->Id] == (Aig_Obj_t **)0x0) {
    return (Aig_Obj_t **)0x0;
  }
  if (1 < p->pClassSizes[pRepr->Id]) {
    *pnSize = p->pClassSizes[pRepr->Id];
    return pppAVar1[pRepr->Id];
  }
  __assert_fail("p->pClassSizes[pRepr->Id] > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                ,0x138,"Aig_Obj_t **Ssw_ClassesReadClass(Ssw_Cla_t *, Aig_Obj_t *, int *)");
}

Assistant:

Aig_Obj_t ** Ssw_ClassesReadClass( Ssw_Cla_t * p, Aig_Obj_t * pRepr, int * pnSize )
{
    if ( p->pId2Class[pRepr->Id] == NULL )
        return NULL;
    assert( p->pId2Class[pRepr->Id] != NULL );
    assert( p->pClassSizes[pRepr->Id] > 1 );
    *pnSize = p->pClassSizes[pRepr->Id];
    return p->pId2Class[pRepr->Id];
}